

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_14::TileProcess::run_fill
          (TileProcess *this,DeepFrameBuffer *outfb,int fb_absX,int fb_absY,int t_absX,int t_absY,
          vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *filllist)

{
  double dVar1;
  int iVar2;
  int iVar3;
  PixelType PVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  bool bVar8;
  reference pDVar9;
  undefined8 uVar10;
  ArgExc *this_00;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t s_2;
  float *fillptr_2;
  float fillVal_2;
  int32_t s_1;
  half *fillptr_1;
  half fillVal_1;
  int32_t s;
  uint *fillptr;
  uint fillVal;
  void *dest;
  int32_t samps;
  int sx;
  uint8_t *outptr;
  int32_t *counts;
  int start;
  int yOffset;
  int xOffset;
  uint8_t *ptr;
  DeepSlice *fills;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *__range1;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  ArgExc *in_stack_ffffffffffffff20;
  int local_d0;
  int local_cc;
  int local_b4;
  int local_a4;
  undefined2 local_96;
  int local_94;
  int local_74;
  long *local_70;
  int local_60;
  long *local_48;
  __normal_iterator<const_Imf_3_3::DeepSlice_*,_std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>_>
  local_30 [2];
  int local_20;
  int local_1c;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_30[0]._M_current =
       (DeepSlice *)
       std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>::begin
                 ((vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *)
                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>::end
            ((vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  while( true ) {
    bVar8 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Imf_3_3::DeepSlice_*,_std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<const_Imf_3_3::DeepSlice_*,_std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (!bVar8) {
      return;
    }
    pDVar9 = __gnu_cxx::
             __normal_iterator<const_Imf_3_3::DeepSlice_*,_std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>_>
             ::operator*(local_30);
    if (((pDVar9->super_Slice).xSampling != 1) || ((pDVar9->super_Slice).ySampling != 1)) break;
    if (((pDVar9->super_Slice).xTileCoords & 1U) == 0) {
      local_cc = local_1c;
    }
    else {
      local_cc = 0;
    }
    if (((pDVar9->super_Slice).yTileCoords & 1U) == 0) {
      local_d0 = local_20;
    }
    else {
      local_d0 = 0;
    }
    local_48 = (long *)((pDVar9->super_Slice).base +
                       (long)local_d0 * (pDVar9->super_Slice).yStride +
                       (long)local_cc * (pDVar9->super_Slice).xStride);
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x14); local_60 = local_60 + 1) {
      lVar5 = *(long *)(in_RDI + 0xf0);
      iVar2 = *(int *)(in_RDI + 0x18);
      local_70 = local_48;
      for (local_74 = 0; local_74 < *(int *)(in_RDI + 0x18); local_74 = local_74 + 1) {
        iVar3 = *(int *)((long)local_60 * (long)iVar2 * 4 + lVar5 + (long)local_74 * 4);
        lVar6 = *local_70;
        if (iVar3 == 0) {
          sVar7 = (pDVar9->super_Slice).xStride;
        }
        else {
          PVar4 = (pDVar9->super_Slice).type;
          if (PVar4 == UINT) {
            dVar1 = (pDVar9->super_Slice).fillValue;
            for (local_94 = 0; local_94 < iVar3; local_94 = local_94 + 1) {
              *(int *)(lVar6 + (long)local_94 * 4) = (int)(long)dVar1;
            }
          }
          else if (PVar4 == HALF) {
            Imath_3_1::half::half((half *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
            for (local_a4 = 0; local_a4 < iVar3; local_a4 = local_a4 + 1) {
              *(undefined2 *)(lVar6 + (long)local_a4 * 2) = local_96;
            }
          }
          else {
            if (PVar4 != FLOAT) {
              this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_3::ArgExc::ArgExc
                        (this_00,(char *)CONCAT44(in_stack_ffffffffffffff1c,
                                                  in_stack_ffffffffffffff18));
              __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
            }
            dVar1 = (pDVar9->super_Slice).fillValue;
            for (local_b4 = 0; local_b4 < iVar3; local_b4 = local_b4 + 1) {
              *(float *)(lVar6 + (long)local_b4 * 4) = (float)dVar1;
            }
          }
          sVar7 = (pDVar9->super_Slice).xStride;
        }
        local_70 = (long *)(sVar7 + (long)local_70);
      }
      local_48 = (long *)((pDVar9->super_Slice).yStride + (long)local_48);
    }
    __gnu_cxx::
    __normal_iterator<const_Imf_3_3::DeepSlice_*,_std::vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_>_>
    ::operator++(local_30);
  }
  uVar10 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc
            (in_stack_ffffffffffffff20,
             (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  __cxa_throw(uVar10,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void TileProcess::run_fill (
    const DeepFrameBuffer *outfb, int fb_absX, int fb_absY, int t_absX, int t_absY,
    const std::vector<DeepSlice> &filllist)
{
    for (auto& fills: filllist)
    {
        uint8_t* ptr;

        if (fills.xSampling != 1 || fills.ySampling != 1)
            throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");

        int xOffset = fills.xTileCoords ? 0 : t_absX;
        int yOffset = fills.yTileCoords ? 0 : t_absY;

        ptr  = reinterpret_cast<uint8_t*> (fills.base);
        ptr += int64_t (xOffset) * int64_t (fills.xStride);
        ptr += int64_t (yOffset) * int64_t (fills.yStride);

        // TODO: update ImfMisc, lift fill type / value
        for ( int start = 0; start < cinfo.height; ++start )
        {
            const int32_t* counts = decoder.sample_count_table;
            counts += (int64_t) start * (int64_t) cinfo.width;

            uint8_t* outptr = ptr;
            for ( int sx = 0; sx < cinfo.width; ++sx )
            {
                int32_t samps = counts[sx];
                void *dest = *((void **)outptr);

                if (samps == 0)
                {
                    outptr += fills.xStride;
                    continue;
                }

                switch (fills.type)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
                    {
                        unsigned int fillVal = (unsigned int) (fills.fillValue);
                        unsigned int* fillptr = static_cast<unsigned int*> (dest);

                        for ( int32_t s = 0; s < samps; ++s )
                            fillptr[s] = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
                    {
                        half fillVal = half (fills.fillValue);
                        half* fillptr = static_cast<half*> (dest);

                        for ( int32_t s = 0; s < samps; ++s )
                            fillptr[s] = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
                    {
                        float fillVal = float (fills.fillValue);
                        float* fillptr = static_cast<float*> (dest);

                        for ( int32_t s = 0; s < samps; ++s )
                            fillptr[s] = fillVal;
                        break;
                    }
                    default:
                        throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
                }
                outptr += fills.xStride;
            }

            ptr += fills.yStride;
        }
    }
}